

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilDouble.h
# Opt level: O2

xdbl Xdbl_Add(xdbl a,xdbl b)

{
  xdbl xVar1;
  ulong uVar2;
  word Exp;
  
  xVar1 = b;
  if (b < a) {
    xVar1 = a;
  }
  if (a < b) {
    b = a;
  }
  uVar2 = ((b & 0xffffffffffff) >> ((char)(xVar1 >> 0x30) - (char)(b >> 0x30) & 0x3fU)) +
          (xVar1 & 0xffffffffffff);
  Exp = (xVar1 >> 0x30) + (uVar2 >> 0x30);
  if (Exp < 0x10000) {
    xVar1 = Xdbl_Create(Exp,uVar2 >> ((byte)(uVar2 >> 0x30) & 0x3f));
    return xVar1;
  }
  return 0xffffffffffffffff;
}

Assistant:

static inline xdbl Xdbl_Add( xdbl a, xdbl b )
{
    word Exp, Mnt;
    if ( a < b ) a ^= b, b ^= a, a ^= b;
    assert( a >= b );
    Mnt = Xdbl_Mnt(a) + (Xdbl_Mnt(b) >> (Xdbl_Exp(a) - Xdbl_Exp(b)));
    Exp = Xdbl_Exp(a);
    if ( Mnt >> 48 ) // new MSB is created
        Exp++, Mnt >>= 1;
    if ( Exp >> 16 ) // overflow
        return Xdbl_Maximum();
    return Xdbl_Create( Exp, Mnt );
}